

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

group * clipp::operator&(group *__return_storage_ptr__,group *a,parameter *b)

{
  bool bVar1;
  __type_conflict _Var2;
  group local_1b0;
  group local_168;
  parameter local_120;
  
  (b->super_token<clipp::parameter>).blocking_ = true;
  bVar1 = group::all_blocking(a);
  if ((((bVar1) && (a->exclusive_ == false)) &&
      ((a->super_token<clipp::group>).repeatable_ == false)) && (a->joinable_ == false)) {
    if ((a->super_token<clipp::group>).doc_._M_string_length != 0) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a
                              ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               b);
      if (!_Var2) goto LAB_0010571d;
    }
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::emplace_back<clipp::parameter>(&a->children_,b);
    group::group(__return_storage_ptr__,a);
  }
  else {
LAB_0010571d:
    bVar1 = group::all_blocking(a);
    if (!bVar1) {
      (a->super_token<clipp::group>).blocking_ = true;
    }
    group::group(&local_168,a);
    parameter::parameter(&local_120,b);
    group::group<clipp::parameter>(&local_1b0,&local_168,&local_120);
    local_1b0.scoped_ = true;
    group::group(__return_storage_ptr__,&local_1b0);
    group::~group(&local_1b0);
    parameter::~parameter(&local_120);
    group::~group(&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator & (group a, parameter b)
{
    b.blocking(true);
    if(a.all_blocking() && !a.exclusive() && !a.repeatable() && !a.joinable()
        && (a.doc().empty() || a.doc() == b.doc()))
    {
        return a.push_back(std::move(b));
    }
    else {
        if(!a.all_blocking()) a.blocking(true);
        return group{std::move(a), std::move(b)}.scoped(true);
    }
}